

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sameSrcAlias(SrcItem *p0,SrcList *pSrc)

{
  int iVar1;
  SrcItem *in_RSI;
  undefined1 *in_RDI;
  SrcItem *p1;
  int i;
  char **zLeft;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  do {
    if (*(int *)&in_RSI->zName <= iVar2) {
      return 0;
    }
    zLeft = &in_RSI[iVar2].zAlias;
    if (zLeft != (char **)in_RDI) {
      if ((*(long *)(in_RDI + 0x10) == *(long *)(zLeft + 2)) &&
         (iVar1 = sqlite3_stricmp((char *)zLeft,(char *)0x1e6181), iVar1 == 0)) {
        return 1;
      }
      if ((((*(ushort *)((long)zLeft + 0x19) >> 2 & 1) != 0) &&
          ((*(uint *)(*(long *)zLeft[8] + 4) & 0x800) != 0)) &&
         (iVar1 = sameSrcAlias(in_RSI,(SrcList *)CONCAT44(iVar2,in_stack_ffffffffffffffe0)),
         iVar1 != 0)) {
        return 1;
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static int sameSrcAlias(SrcItem *p0, SrcList *pSrc){
  int i;
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *p1 = &pSrc->a[i];
    if( p1==p0 ) continue;
    if( p0->pSTab==p1->pSTab && 0==sqlite3_stricmp(p0->zAlias, p1->zAlias) ){
      return 1;
    }
    if( p1->fg.isSubquery
     && (p1->u4.pSubq->pSelect->selFlags & SF_NestedFrom)!=0
     && sameSrcAlias(p0, p1->u4.pSubq->pSelect->pSrc)
    ){
      return 1;
    }
  }
  return 0;
}